

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QRectF * __thiscall
QWidgetTextControlPrivate::cursorRectPlusUnicodeDirectionMarkers
          (QWidgetTextControlPrivate *this,QTextCursor *cursor)

{
  long lVar1;
  ulong uVar2;
  qreal in_RDX;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000034;
  QWidgetTextControlPrivate *in_stack_00000038;
  QRectF *xp2;
  QRectF *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xp2 = in_RDI;
  this_00 = in_RSI;
  uVar2 = QTextCursor::isNull();
  if ((uVar2 & 1) == 0) {
    QTextCursor::position();
    rectForPosition(in_stack_00000038,in_stack_00000034);
    QRectF::adjusted(this_00,in_RDX,(qreal)in_RSI,(qreal)xp2,(qreal)in_RDI);
  }
  else {
    QRectF::QRectF(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return xp2;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetTextControlPrivate::cursorRectPlusUnicodeDirectionMarkers(const QTextCursor &cursor) const
{
    if (cursor.isNull())
        return QRectF();

    return rectForPosition(cursor.position()).adjusted(-4, 0, 4, 0);
}